

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  duration<long,_std::ratio<1L,_1000000L>_> local_30;
  
  E64::sdl2_init();
  machine.turned_on = true;
  E64::stats_t::reset(&stats);
  refresh_moment.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  while (machine.turned_on == true) {
    if (machine.mode == MONITOR) {
      bVar2 = E64::tty_t::cursor_flash(monitor.tty);
      if (bVar2) {
        E64::status_bar_t::refresh(monitor.status_bar);
        E64::tty_t::blit_to_screen(monitor.tty);
        E64::screen_t::update(monitor.screen);
        E64::video_t::update_screen(host.video);
      }
      local_30.__r = 10000;
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_30);
      iVar3 = E64::sdl2_process_events();
      if (iVar3 == 1) {
        E64::status_bar_t::refresh(monitor.status_bar);
        E64::tty_t::blit_to_screen(monitor.tty);
        E64::screen_t::update(monitor.screen);
        E64::video_t::update_screen(host.video);
      }
      else if (iVar3 == -1) {
        machine.turned_on = false;
      }
    }
    else if (machine.mode == RUNNING) {
      uVar1 = E64::machine_t::run(&machine,0x3f);
      if (uVar1 != '\0') {
        E64::machine_t::switch_mode(&machine,MONITOR);
      }
      if ((machine.vicv)->frame_done == true) {
        (machine.vicv)->frame_done = false;
        iVar3 = E64::sdl2_process_events();
        if (iVar3 == -1) {
          machine.turned_on = false;
        }
        E64::stats_t::process_parameters(&stats);
        E64::stats_t::start_idle_time(&stats);
        if ((host.video)->vsync == false) {
          refresh_moment.__d.__r =
               (duration)((long)refresh_moment.__d.__r + (ulong)stats.frametime * 1000);
          lVar4 = std::chrono::_V2::steady_clock::now();
          if ((long)refresh_moment.__d.__r < lVar4) {
            lVar4 = std::chrono::_V2::steady_clock::now();
            refresh_moment.__d.__r = (duration)((ulong)stats.frametime * 1000 + lVar4);
          }
          std::this_thread::
          sleep_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                    (&refresh_moment);
        }
        E64::video_t::update_screen(host.video);
        E64::stats_t::end_idle_time(&stats);
      }
    }
  }
  E64::sdl2_cleanup();
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	E64::sdl2_init();

//	machine.switch_mode(E64::MONITOR);
	machine.turned_on = true;

	stats.reset();
	
	refresh_moment = std::chrono::steady_clock::now();

	while (machine.turned_on) {
		switch (machine.mode) {
			case E64::RUNNING:
				running_frame();
				break;
			case E64::MONITOR:
				monitor_frame();
				break;
		}
	}

	E64::sdl2_cleanup();
	return 0;
}